

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_free(Terminal *term)

{
  void *pvVar1;
  tree234 *t;
  beeptime *ptr;
  long lVar2;
  ulong uVar3;
  
  t = term->scrollback;
  while (pvVar1 = delpos234(t,0), pvVar1 != (void *)0x0) {
    safefree(pvVar1);
    t = term->scrollback;
  }
  freetree234(term->scrollback);
  pvVar1 = delpos234(term->screen,0);
  while (pvVar1 != (void *)0x0) {
    safefree(*(void **)((long)pvVar1 + 0x18));
    safefree(pvVar1);
    pvVar1 = delpos234(term->screen,0);
  }
  freetree234(term->screen);
  pvVar1 = delpos234(term->alt_screen,0);
  while (pvVar1 != (void *)0x0) {
    safefree(*(void **)((long)pvVar1 + 0x18));
    safefree(pvVar1);
    pvVar1 = delpos234(term->alt_screen,0);
  }
  freetree234(term->alt_screen);
  if ((term->disptext != (termline **)0x0) && (L'\0' < term->rows)) {
    lVar2 = 0;
    do {
      freetermline(term->disptext[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < term->rows);
  }
  ptr = (beeptime *)term->disptext;
  while( true ) {
    safefree(ptr);
    ptr = term->beephead;
    if (ptr == (beeptime *)0x0) break;
    term->beephead = (beeptime *)ptr->next;
  }
  bufchain_clear(&term->inbuf);
  if (term->print_job != (printer_job *)0x0) {
    printer_finish_job(term->print_job);
  }
  bufchain_clear(&term->printer_buf);
  safefree(term->paste_buffer);
  safefree(term->ltemp);
  safefree(term->wcFrom);
  safefree(term->wcTo);
  safefree(term->answerback);
  if (term->bidi_cache_size != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      safefree(*(void **)((long)&term->pre_bidi_cache->chars + lVar2));
      safefree(*(void **)((long)&term->post_bidi_cache->chars + lVar2));
      safefree(*(void **)((long)&term->post_bidi_cache->forward + lVar2));
      safefree(*(void **)((long)&term->post_bidi_cache->backward + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < term->bidi_cache_size);
  }
  safefree(term->pre_bidi_cache);
  safefree(term->post_bidi_cache);
  safefree(term->tabs);
  expire_timer_context(term);
  delete_callbacks_for_context(term);
  conf_free(term->conf);
  safefree(term->window_title);
  safefree(term->icon_title);
  bidi_free_context(term->bidi_ctx);
  safefree(term);
  return;
}

Assistant:

void term_free(Terminal *term)
{
    termline *line;
    struct beeptime *beep;
    int i;

    while ((line = delpos234(term->scrollback, 0)) != NULL)
        sfree(line);                   /* compressed data, not a termline */
    freetree234(term->scrollback);
    while ((line = delpos234(term->screen, 0)) != NULL)
        freetermline(line);
    freetree234(term->screen);
    while ((line = delpos234(term->alt_screen, 0)) != NULL)
        freetermline(line);
    freetree234(term->alt_screen);
    if (term->disptext) {
        for (i = 0; i < term->rows; i++)
            freetermline(term->disptext[i]);
    }
    sfree(term->disptext);
    while (term->beephead) {
        beep = term->beephead;
        term->beephead = beep->next;
        sfree(beep);
    }
    bufchain_clear(&term->inbuf);
    if(term->print_job)
        printer_finish_job(term->print_job);
    bufchain_clear(&term->printer_buf);
    sfree(term->paste_buffer);
    sfree(term->ltemp);
    sfree(term->wcFrom);
    sfree(term->wcTo);
    sfree(term->answerback);

    for (i = 0; i < term->bidi_cache_size; i++) {
        sfree(term->pre_bidi_cache[i].chars);
        sfree(term->post_bidi_cache[i].chars);
        sfree(term->post_bidi_cache[i].forward);
        sfree(term->post_bidi_cache[i].backward);
    }
    sfree(term->pre_bidi_cache);
    sfree(term->post_bidi_cache);

    sfree(term->tabs);

    expire_timer_context(term);
    delete_callbacks_for_context(term);

    conf_free(term->conf);

    sfree(term->window_title);
    sfree(term->icon_title);

    bidi_free_context(term->bidi_ctx);

    sfree(term);
}